

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bst.c
# Opt level: O0

void dlist_erase(vmd_bst_node_t **list,vmd_bst_node_t *node)

{
  vmd_bst_node_t *node_local;
  vmd_bst_node_t **list_local;
  
  if (node->child[0] == node) {
    *list = (vmd_bst_node_t *)0x0;
  }
  else {
    if (*list == node) {
      *list = node->child[0];
    }
    node->child[1]->child[0] = node->child[0];
    node->child[0]->child[1] = node->child[1];
  }
  return;
}

Assistant:

static void
dlist_erase(bst_node_t **list, bst_node_t *node)
{
	if (node->child[0] == node) {
		*list = NULL;
		return;
	}

	if (*list == node)
		*list = node->child[0];

	node->child[1]->child[0] = node->child[0];
	node->child[0]->child[1] = node->child[1];
}